

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::ForkBranch<kj::_::Void,_true>::get
          (ForkBranch<kj::_::Void,_true> *this,ExceptionOrValue *output)

{
  ExceptionOrValue *this_00;
  ExceptionOr<kj::_::Void> *pEVar1;
  Void local_31;
  Void *local_30;
  Void *value;
  Void *_value846;
  ExceptionOr<kj::_::Void> *hubResult;
  ExceptionOrValue *output_local;
  ForkBranch<kj::_::Void,_true> *this_local;
  
  hubResult = (ExceptionOr<kj::_::Void> *)output;
  output_local = (ExceptionOrValue *)this;
  this_00 = ForkBranchBase::getHubResultRef(&this->super_ForkBranchBase);
  _value846 = (Void *)ExceptionOrValue::as<kj::_::Void>(this_00);
  value = readMaybe<kj::_::Void>(&((ExceptionOr<kj::_::Void> *)_value846)->value);
  if (value == (Void *)0x0) {
    pEVar1 = ExceptionOrValue::as<kj::_::Void>(&hubResult->super_ExceptionOrValue);
    Maybe<kj::_::Void>::operator=(&pEVar1->value);
  }
  else {
    local_30 = value;
    copyOrAddRef<kj::_::Void>(value);
    pEVar1 = ExceptionOrValue::as<kj::_::Void>(&hubResult->super_ExceptionOrValue);
    Maybe<kj::_::Void>::operator=(&pEVar1->value,&local_31);
  }
  Maybe<kj::Exception>::operator=
            ((Maybe<kj::Exception> *)hubResult,(Maybe<kj::Exception> *)_value846);
  ForkBranchBase::releaseHub(&this->super_ForkBranchBase,&hubResult->super_ExceptionOrValue);
  return;
}

Assistant:

void get(ExceptionOrValue& output) noexcept override {
    ExceptionOr<T>& hubResult = getHubResultRef().template as<T>();
    KJ_IF_SOME(value, hubResult.value) {
      output.as<T>().value = copyOrAddRef(value);
    } else {
      output.as<T>().value = kj::none;
    }